

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O0

void M_Drawer(void)

{
  uint uVar1;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_20;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_1c;
  AActor *pAStack_18;
  PalEntry fade;
  AActor *camera;
  player_t *player;
  
  camera = (AActor *)(&players + (long)consoleplayer * 0x54);
  pAStack_18 = TObjPtr::operator_cast_to_AActor_
                         ((TObjPtr *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
  PalEntry::PalEntry((PalEntry *)&local_1c.field_0,0);
  if ((((screen->Accel2D & 1U) == 0) && (pAStack_18 != (AActor *)0x0)) &&
     ((gamestate == GS_LEVEL || (gamestate == GS_TITLELEVEL)))) {
    if (pAStack_18->player != (player_t *)0x0) {
      camera = (AActor *)pAStack_18->player;
    }
    PalEntry::PalEntry((PalEntry *)&local_20.field_0,
                       (BYTE)(int)(*(float *)&camera->field_0x1ac * 255.0),
                       (BYTE)(int)(*(float *)&camera->state * 255.0),
                       (BYTE)(int)(*(float *)((long)&camera->state + 4) * 255.0),
                       (BYTE)(int)((float)camera->DamageVal * 255.0));
    local_1c = local_20;
  }
  if ((DMenu::CurrentMenu != (DMenu *)0x0) && (menuactive != MENU_Off)) {
    uVar1 = (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[0xb])();
    if ((uVar1 & 1) != 0) {
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xd])
                (screen,(ulong)local_1c.d);
      V_SetBorderNeedRefresh();
    }
    (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[10])();
  }
  return;
}

Assistant:

void M_Drawer (void) 
{
	player_t *player = &players[consoleplayer];
	AActor *camera = player->camera;
	PalEntry fade = 0;

	if (!screen->Accel2D && camera != NULL && (gamestate == GS_LEVEL || gamestate == GS_TITLELEVEL))
	{
		if (camera->player != NULL)
		{
			player = camera->player;
		}
		fade = PalEntry (BYTE(player->BlendA*255), BYTE(player->BlendR*255), BYTE(player->BlendG*255), BYTE(player->BlendB*255));
	}


	if (DMenu::CurrentMenu != NULL && menuactive != MENU_Off) 
	{
		if (DMenu::CurrentMenu->DimAllowed())
		{
			screen->Dim(fade);
			V_SetBorderNeedRefresh();
		}
		DMenu::CurrentMenu->Drawer();
	}
}